

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
          (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this,size_t size)

{
  ulong uVar1;
  char *__src;
  size_t __n;
  char *__dest;
  ulong uVar2;
  
  uVar1 = (this->super_buffer<char>).capacity_;
  uVar2 = (uVar1 >> 1) + uVar1;
  if (uVar2 <= size) {
    uVar2 = size;
  }
  if ((long)uVar2 < 0) {
    std::__throw_bad_alloc();
  }
  __src = (this->super_buffer<char>).ptr_;
  __dest = (char *)operator_new(uVar2);
  __n = (this->super_buffer<char>).size_;
  if (__n != 0) {
    memmove(__dest,__src,__n);
  }
  (this->super_buffer<char>).ptr_ = __dest;
  (this->super_buffer<char>).capacity_ = uVar2;
  if (__src != this->store_) {
    operator_delete(__src,uVar1);
    return;
  }
  return;
}

Assistant:

basic_memory_buffer(basic_memory_buffer&& other) FMT_NOEXCEPT { move(other); }